

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

Float __thiscall pbrt::Cylinder::PDF(Cylinder *this,ShapeSampleContext *ctx,Vector3f wi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Normal3<float> n;
  Point3<float> p2;
  Point3<float> p1;
  Vector3f w;
  bool bVar3;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar4;
  ShapeIntersection *pSVar5;
  Cylinder *in_RDI;
  Float FVar6;
  type tVar7;
  float fVar8;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  undefined4 in_XMM1_Da;
  Vector3<float> VVar13;
  Point3f PVar14;
  Float pdf;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffda8;
  float fVar15;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined8 in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf8;
  float local_188;
  optional local_180 [264];
  Ray *local_78;
  Ray *local_68;
  Cylinder *pCVar16;
  Ray *ray_00;
  undefined4 in_stack_ffffffffffffffec;
  float local_4;
  undefined1 auVar12 [56];
  
  local_78 = (Ray *)vmovlpd_avx(in_ZMM0._0_16_);
  w.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffdf8;
  w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffffdf0;
  local_68 = local_78;
  pCVar16 = in_RDI;
  ray_00 = local_78;
  ShapeSampleContext::SpawnRay
            ((ShapeSampleContext *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),w);
  Intersect((Cylinder *)CONCAT44(in_stack_ffffffffffffffec,in_XMM1_Da),ray_00,
            (Float)((ulong)pCVar16 >> 0x20));
  bVar3 = pstd::optional::operator_cast_to_bool(local_180);
  if (bVar3) {
    FVar6 = Area(in_RDI);
    local_188 = 1.0 / FVar6;
    uVar10 = 0;
    pSVar5 = pstd::optional<pbrt::ShapeIntersection>::operator->
                       ((optional<pbrt::ShapeIntersection> *)0x8c4af4);
    fVar15 = SUB84(pSVar5,0);
    VVar13 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    fVar8 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar2._8_8_ = uVar10;
    auVar2._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    vmovlpd_avx(auVar2);
    n.super_Tuple3<pbrt::Normal3,_float>.y = local_188;
    n.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffda8;
    n.super_Tuple3<pbrt::Normal3,_float>.z = fVar15;
    VVar13.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffd90;
    VVar13.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffd8c;
    VVar13.super_Tuple3<pbrt::Vector3,_float>.z = fVar8;
    tVar7 = AbsDot<float>(n,VVar13);
    auVar12 = extraout_var;
    PVar14 = ShapeSampleContext::p((ShapeSampleContext *)CONCAT44(fVar8,tVar7));
    auVar9._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar9._8_56_ = auVar12;
    uVar11 = 0;
    uVar10 = vmovlpd_avx(auVar9._0_16_);
    pstd::optional<pbrt::ShapeIntersection>::operator->
              ((optional<pbrt::ShapeIntersection> *)0x8c4c3e);
    PVar14 = Interaction::p((Interaction *)CONCAT44(fVar8,tVar7));
    auVar1._8_8_ = uVar11;
    auVar1._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
    vmovlpd_avx(auVar1);
    p1.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffdcc;
    p1.super_Tuple3<pbrt::Point3,_float>.x = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
    p1.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar10;
    p2.super_Tuple3<pbrt::Point3,_float>.y = local_188;
    p2.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffda8;
    p2.super_Tuple3<pbrt::Point3,_float>.z = fVar15;
    fVar8 = DistanceSquared<float>(p1,p2);
    local_188 = local_188 / (tVar7 / fVar8);
    eVar4 = IsInf<float>(0.0);
    if (eVar4) {
      local_188 = 0.0;
    }
    local_4 = local_188;
  }
  else {
    local_4 = 0.0;
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional((optional<pbrt::ShapeIntersection> *)0x8c4d9d);
  return local_4;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
        // Intersect sample ray with shape geometry
        Ray ray = ctx.SpawnRay(wi);
        pstd::optional<ShapeIntersection> isect = Intersect(ray);
        if (!isect)
            return 0;

        // Compute PDF in solid angle measure from shape intersection point
        Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                    DistanceSquared(ctx.p(), isect->intr.p()));
        if (IsInf(pdf))
            pdf = 0;

        return pdf;
    }